

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O1

void __thiscall QComboBoxPrivate::emitActivated(QComboBoxPrivate *this,QModelIndex *index)

{
  QObject *pQVar1;
  long in_FS_OFFSET;
  QString local_68;
  int local_4c;
  void *local_48;
  int *piStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (((-1 < index->r) && (-1 < index->c)) && ((index->m).ptr != (QAbstractItemModel *)0x0)) {
    pQVar1 = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
    local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    itemText(&local_68,this,index);
    local_4c = index->r;
    piStack_40 = &local_4c;
    local_48 = (void *)0x0;
    QMetaObject::activate(pQVar1,&QComboBox::staticMetaObject,1,&local_48);
    local_48 = (void *)0x0;
    piStack_40 = (int *)&local_68;
    QMetaObject::activate(pQVar1,&QComboBox::staticMetaObject,2,&local_48);
    if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::emitActivated(const QModelIndex &index)
{
    Q_Q(QComboBox);
    if (!index.isValid())
        return;
    QString text(itemText(index));
    emit q->activated(index.row());
    emit q->textActivated(text);
}